

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O0

void __thiscall
anurbs::PointOnCurveProjection<3L>::PointOnCurveProjection
          (PointOnCurveProjection<3L> *this,Pointer<CurveBaseD>_conflict *curve,double tolerance,
          double tessellation_tolerance)

{
  element_type *curve_00;
  unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_> local_80
  ;
  double local_28;
  double tessellation_tolerance_local;
  double tolerance_local;
  Pointer<CurveBaseD>_conflict *curve_local;
  PointOnCurveProjection<3L> *this_local;
  
  local_28 = tessellation_tolerance;
  tessellation_tolerance_local = tolerance;
  tolerance_local = (double)curve;
  curve_local = (Pointer<CurveBaseD>_conflict *)this;
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_true>
            (&this->m_tessellation);
  std::shared_ptr<anurbs::CurveBase<3L>_>::shared_ptr(&this->m_curve,curve);
  this->m_tessellation_tolerance = local_28;
  this->m_tolerance = tessellation_tolerance_local;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&this->m_point);
  std::unique_ptr<anurbs::PolylineMapper<3l>,std::default_delete<anurbs::PolylineMapper<3l>>>::
  unique_ptr<std::default_delete<anurbs::PolylineMapper<3l>>,void>
            ((unique_ptr<anurbs::PolylineMapper<3l>,std::default_delete<anurbs::PolylineMapper<3l>>>
              *)&this->mapper);
  Curve((PointOnCurveProjection<3L> *)&stack0xffffffffffffff88);
  curve_00 = std::
             __shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&stack0xffffffffffffff88);
  CurveTessellation<3L>::compute
            ((pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
              *)&stack0xffffffffffffff98,curve_00,this->m_tessellation_tolerance);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::operator=(&this->m_tessellation,(type)&stack0xffffffffffffff98);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::~pair((type)&stack0xffffffffffffff98);
  std::shared_ptr<anurbs::CurveBase<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::CurveBase<3L>_> *)&stack0xffffffffffffff88);
  new_<anurbs::PolylineMapper<3l>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>&>
            ((anurbs *)&local_80,&(this->m_tessellation).second);
  std::unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>::
  operator=(&this->mapper,&local_80);
  std::unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>::
  ~unique_ptr(&local_80);
  return;
}

Assistant:

PointOnCurveProjection(Pointer<CurveBaseD> curve, const double tolerance, const double tessellation_tolerance)
        : m_tessellation()
        , m_curve(curve)
        , m_tessellation_tolerance(tessellation_tolerance)
        , m_tolerance(tolerance)
    {
        // new_ polyline
        m_tessellation = CurveTessellation<TDimension>::compute(*Curve(), m_tessellation_tolerance);
        mapper = new_<PolylineMapper<TDimension>>(m_tessellation.second);
    }